

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseLFP(EeePLFPDataBlock_t *dblock,int size)

{
  int local_1c;
  int i;
  int raw_size;
  int size_local;
  EeePLFPDataBlock_t *dblock_local;
  
  printf("   LFP block:\n      Interface: %d\n",(ulong)dblock->Interface);
  printf("      Raw Data:\n      ");
  for (local_1c = 0; local_1c < size + -4; local_1c = local_1c + 1) {
    if (local_1c % 0x10 == 0) {
      printf("\n      ");
    }
    printf("%02X ",(ulong)dblock->RawData[local_1c]);
  }
  printf("\n");
  return;
}

Assistant:

void ParseLFP(EeePLFPDataBlock_t *dblock, int size)
{
	int raw_size = size - FIELD_OFFSET(EeePLFPDataBlock_t, RawData);
	printf("   LFP block:\n      Interface: %d\n", dblock->Interface);
	printf("      Raw Data:\n      ");
	for( int i = 0; i < raw_size; i++ ) {
		if( i%16 == 0) {
			printf("\n      ");
		}
		printf("%02X ", dblock->RawData[i]);
	}
	printf("\n");
}